

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O3

int compare_scores(void *a,void *b)

{
  uint uVar1;
  float fVar2;
  
  fVar2 = *(float *)((long)a + 4) - *(float *)((long)b + 4);
  uVar1 = 0xffffffff;
  if (0.0 <= fVar2) {
    uVar1 = (uint)(0.0 < fVar2);
  }
  return uVar1;
}

Assistant:

static int compare_scores(const void *a, const void *b) {
  const float diff =
      ((index_and_score_t *)a)->score - ((index_and_score_t *)b)->score;
  if (diff < 0)
    return -1;
  else if (diff > 0)
    return 1;
  return 0;
}